

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5StorageClose(Fts5Storage *p)

{
  int local_18;
  int i;
  int rc;
  Fts5Storage *p_local;
  
  if (p != (Fts5Storage *)0x0) {
    for (local_18 = 0; local_18 < 0xb; local_18 = local_18 + 1) {
      sqlite3_finalize(p->aStmt[local_18]);
    }
    sqlite3_free(p);
  }
  return 0;
}

Assistant:

static int sqlite3Fts5StorageClose(Fts5Storage *p){
  int rc = SQLITE_OK;
  if( p ){
    int i;

    /* Finalize all SQL statements */
    for(i=0; i<ArraySize(p->aStmt); i++){
      sqlite3_finalize(p->aStmt[i]);
    }

    sqlite3_free(p);
  }
  return rc;
}